

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,FunctionName *func_name,void *data)

{
  bool bVar1;
  LexicalScoping LVar2;
  undefined8 in_RDX;
  vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *in_RSI;
  String *unaff_retaddr;
  SemanticAnalysisVisitor *in_stack_00000008;
  
  bVar1 = std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::empty(in_RSI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!func_name->names_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                  ,0x19b,"virtual void luna::SemanticAnalysisVisitor::Visit(FunctionName *, void *)"
                 );
  }
  std::vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>::operator[]
            ((vector<luna::TokenDetail,_std::allocator<luna::TokenDetail>_> *)
             &(in_RSI->super__Vector_base<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>).
              _M_impl.super__Vector_impl_data._M_finish,0);
  LVar2 = SearchName(in_stack_00000008,unaff_retaddr);
  *(LexicalScoping *)
   &in_RSI[2].super__Vector_base<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = LVar2;
  *(bool *)in_RDX =
       *(int *)&in_RSI[2].super__Vector_base<luna::TokenDetail,_std::allocator<luna::TokenDetail>_>.
                _M_impl.super__Vector_impl_data._M_finish == 0x115;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(FunctionName *func_name, void *data)
    {
        assert(!func_name->names_.empty());
        // Get the scoping of first token of FunctionName
        func_name->scoping_ = SearchName(func_name->names_[0].str_);

        // Set FunctionNameData
        static_cast<FunctionNameData *>(data)->has_member_token_ =
            func_name->member_name_.token_ == Token_Id;
    }